

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::DefineOwnPropertyForArray
               (JavascriptArray *arr,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  uint32 nValue;
  int iVar3;
  BOOL BVar4;
  Var value;
  int32 errorCode;
  undefined1 local_98 [8];
  PropertyDescriptor newWritableDesc;
  uint32 index;
  char local_48;
  
  if (propId == 0xd1) {
    if (descriptor->valueSpecified == false) {
      BVar4 = DefineOwnPropertyDescriptor
                        ((RecyclableObject *)arr,0xd1,descriptor,throwOnError,scriptContext,
                         PropertyOperation_None);
      return BVar4;
    }
    PropertyDescriptor::PropertyDescriptor
              ((PropertyDescriptor *)&newWritableDesc.Configurable,descriptor);
    nValue = ES5Array::ToLengthValue((descriptor->Value).ptr,scriptContext);
    value = JavascriptNumber::ToVar(nValue,scriptContext);
    PropertyDescriptor::SetValue((PropertyDescriptor *)&newWritableDesc.Configurable,value);
    if ((arr->super_ArrayObject).length <= nValue) {
      descriptor = (PropertyDescriptor *)&newWritableDesc.Configurable;
      propId = 0xd1;
LAB_009a7cd7:
      BVar4 = DefineOwnPropertyDescriptor
                        ((RecyclableObject *)arr,propId,descriptor,throwOnError,scriptContext,
                         PropertyOperation_None);
      return BVar4;
    }
    iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x30])(arr,0xd1);
    if (iVar3 == 0) {
      errorCode = -0x7ff5ec29;
      propId = 0xd1;
LAB_009a7d1f:
      Reject(throwOnError,scriptContext,errorCode,propId);
      return 0;
    }
    bVar1 = true;
    if ((local_48 == '\x01') &&
       (bVar2 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&newWritableDesc.Configurable),
       !bVar2)) {
      PropertyDescriptor::SetWritable((PropertyDescriptor *)&newWritableDesc.Configurable,true);
      bVar1 = false;
    }
    BVar4 = DefineOwnPropertyDescriptor
                      ((RecyclableObject *)arr,0xd1,
                       (PropertyDescriptor *)&newWritableDesc.Configurable,throwOnError,
                       scriptContext,PropertyOperation_None);
    if (BVar4 == 0) {
      return 0;
    }
    if (!bVar1) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
      PropertyDescriptor::SetWritable((PropertyDescriptor *)local_98,false);
      DefineOwnPropertyDescriptor
                ((RecyclableObject *)arr,0xd1,(PropertyDescriptor *)local_98,false,scriptContext,
                 PropertyOperation_None);
    }
    if ((arr->super_ArrayObject).length <= nValue) {
      return 1;
    }
    propId = 0xd1;
  }
  else {
    BVar4 = ScriptContext::IsNumericPropertyId
                      (scriptContext,propId,(uint32 *)&newWritableDesc.Configurable);
    if (BVar4 == 0) goto LAB_009a7cd7;
    if (((arr->super_ArrayObject).length <= (uint)newWritableDesc._40_4_) &&
       (iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x30])(arr,0xd1), iVar3 == 0)) {
      errorCode = -0x7ff5ec28;
      goto LAB_009a7d1f;
    }
    BVar4 = DefineOwnPropertyDescriptor
                      ((RecyclableObject *)arr,propId,descriptor,false,scriptContext,
                       PropertyOperation_None);
    if (BVar4 != 0) {
      return 1;
    }
  }
  Reject(throwOnError,scriptContext,-0x7ff5ec27,propId);
  return 0;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyForArray(JavascriptArray* arr, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext)
    {
        if (propId == PropertyIds::length)
        {
            if (!descriptor.ValueSpecified())
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, descriptor, throwOnError, scriptContext);
            }

            PropertyDescriptor newLenDesc = descriptor;
            uint32 newLen = ES5Array::ToLengthValue(descriptor.GetValue(), scriptContext);
            newLenDesc.SetValue(JavascriptNumber::ToVar(newLen, scriptContext));

            uint32 oldLen = arr->GetLength();
            if (newLen >= oldLen)
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            }

            BOOL oldLenWritable = arr->IsWritable(PropertyIds::length);
            if (!oldLenWritable)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_NotWritable, propId);
            }

            bool newWritable = (!newLenDesc.WritableSpecified() || newLenDesc.IsWritable());
            if (!newWritable)
            {
                // Need to defer setting writable to false in case any elements cannot be deleted
                newLenDesc.SetWritable(true);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            //
            // Our SetProperty(length) is also responsible to trim elements. When succeeded is
            //
            //  false:
            //      * length attributes rejected
            //      * elements not touched
            //  true:
            //      * length attributes are set successfully
            //      * elements trimming may be either completed or incompleted, length value is correct
            //
            //      * Strict mode TODO: Currently SetProperty(length) does not throw. If that throws, we need
            //        to update here to set correct newWritable even on exception.
            //
            if (!succeeded)
            {
                return false;
            }

            if (!newWritable) // Now set requested newWritable.
            {
                PropertyDescriptor newWritableDesc;
                newWritableDesc.SetWritable(false);
                DefineOwnPropertyDescriptor(arr, PropertyIds::length, newWritableDesc, false, scriptContext);
            }

            if (arr->GetLength() > newLen) // Delete incompleted
            {
                // Since SetProperty(length) not throwing, we'll reject here
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            return true;
        }

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propId, &index))
        {
            if (index >= arr->GetLength() && !arr->IsWritable(PropertyIds::length))
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_LengthNotWritable, propId);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, propId, descriptor, false, scriptContext);
            if (!succeeded)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            // Out SetItem takes care of growing "length". we are done.
            return true;
        }

        return DefineOwnPropertyDescriptor(arr, propId, descriptor, throwOnError, scriptContext);
    }